

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall testing::Matcher<mp::expr::Kind>::Matcher(Matcher<mp::expr::Kind> *this,Kind value)

{
  linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_> local_38;
  
  (this->super_MatcherBase<mp::expr::Kind>).impl_.value_ = (MatcherInterface<mp::expr::Kind> *)0x0;
  (this->super_MatcherBase<mp::expr::Kind>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::expr::Kind>).impl_.link_;
  (this->super_MatcherBase<mp::expr::Kind>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f3b38;
  local_38.value_ = (MatcherInterface<mp::expr::Kind> *)operator_new(0x10);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002f9ab0;
  *(Kind *)&local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       value;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::operator=
            (&(this->super_MatcherBase<mp::expr::Kind>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }